

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int inflate_gzip_block(BGZF *fp,int cached)

{
  void *__dest;
  hFILE *fp_00;
  int iVar1;
  size_t __n;
  int iVar2;
  z_stream *pzVar3;
  ulong uVar4;
  bool bVar5;
  
  pzVar3 = fp->gz_stream;
  if (cached != 0) goto LAB_0013c493;
  bVar5 = pzVar3->avail_out == 0;
  do {
    if (!bVar5) {
      __dest = fp->compressed_block;
      fp_00 = fp->fp;
      uVar4 = (long)fp_00->end - (long)fp_00->begin;
      __n = 0xff00;
      if (uVar4 < 0xff00) {
        __n = uVar4;
      }
      memcpy(__dest,fp_00->begin,__n);
      fp_00->begin = fp_00->begin + __n;
      if (uVar4 < 0xff00) {
        __n = hread2(fp_00,__dest,0xff00,__n);
      }
      pzVar3 = fp->gz_stream;
      pzVar3->avail_in = (uInt)__n;
      if ((uInt)__n == 0) {
        return 0;
      }
      pzVar3->next_in = (Bytef *)fp->compressed_block;
    }
LAB_0013c493:
    do {
      iVar1 = fp->block_offset;
      pzVar3->next_out = (Bytef *)((long)iVar1 + (long)fp->uncompressed_block);
      pzVar3->avail_out = 0x10000 - iVar1;
      iVar1 = inflate(pzVar3,0);
      if (iVar1 != -5) {
        if (iVar1 < 0) {
          return -1;
        }
        pzVar3 = fp->gz_stream;
        iVar2 = 0;
        if (pzVar3->avail_out != 0x10000) {
          return 0x10000 - pzVar3->avail_out;
        }
        goto LAB_0013c4de;
      }
      pzVar3 = fp->gz_stream;
    } while (pzVar3->avail_out == 0);
    iVar2 = 0x10000 - pzVar3->avail_out;
LAB_0013c4de:
    bVar5 = false;
    if (iVar1 == 1) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int inflate_gzip_block(BGZF *fp, int cached)
{
    int ret = Z_OK;
    do
    {
        if ( !cached && fp->gz_stream->avail_out!=0 )
        {
            fp->gz_stream->avail_in = hread(fp->fp, fp->compressed_block, BGZF_BLOCK_SIZE);
            if ( fp->gz_stream->avail_in<=0 ) return fp->gz_stream->avail_in;
            if ( fp->gz_stream->avail_in==0 ) break;
            fp->gz_stream->next_in = fp->compressed_block;
        }
        else cached = 0;
        do
        {
            fp->gz_stream->next_out = (Bytef*)fp->uncompressed_block + fp->block_offset;
            fp->gz_stream->avail_out = BGZF_MAX_BLOCK_SIZE - fp->block_offset;
            ret = inflate(fp->gz_stream, Z_NO_FLUSH);
            if ( ret==Z_BUF_ERROR ) continue;   // non-critical error
            if ( ret<0 ) return -1;
            unsigned int have = BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
            if ( have ) return have;
        }
        while ( fp->gz_stream->avail_out == 0 );
    }
    while (ret != Z_STREAM_END);
    return BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
}